

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

void __thiscall
pbrt::PixelSensor::PixelSensor
          (PixelSensor *this,RGBColorSpace *outputColorSpace,Float wbTemp,Float imagingRatio,
          Allocator alloc)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar5 [16];
  XYZ XVar6;
  DenselySampledSpectrum whiteIlluminant;
  SpectrumHandle local_98;
  SpectrumHandle local_90;
  SpectrumHandle local_88;
  SpectrumHandle local_80;
  SquareMatrix<3> local_74;
  DenselySampledSpectrum local_50;
  undefined1 auVar4 [56];
  
  SquareMatrix<3>::SquareMatrix(&this->XYZFromSensorRGB);
  local_80.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(Spectra::x | 0x2000000000000);
  DenselySampledSpectrum::DenselySampledSpectrum(&this->r_bar,&local_80,alloc);
  local_88.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(Spectra::y | 0x2000000000000);
  DenselySampledSpectrum::DenselySampledSpectrum(&this->g_bar,&local_88,alloc);
  local_90.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(Spectra::z | 0x2000000000000);
  DenselySampledSpectrum::DenselySampledSpectrum(&this->b_bar,&local_90,alloc);
  this->imagingRatio = imagingRatio;
  if ((wbTemp != 0.0) || (NAN(wbTemp))) {
    auVar4 = ZEXT856(0);
    Spectra::D(&local_50,wbTemp,alloc);
    local_98.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )((ulong)&local_50 | 0x2000000000000);
    XVar6 = SpectrumToXYZ(&local_98);
    auVar3._0_8_ = XVar6._0_8_;
    auVar3._8_56_ = auVar4;
    auVar2 = auVar3._0_16_;
    auVar5 = vhaddps_avx(auVar2,auVar2);
    fVar1 = XVar6.Z + auVar5._0_4_;
    auVar5._4_4_ = fVar1;
    auVar5._0_4_ = fVar1;
    auVar5._8_4_ = fVar1;
    auVar5._12_4_ = fVar1;
    auVar5 = vdivps_avx(auVar2,auVar5);
    WhiteBalance(&local_74,(Point2f)auVar5._0_8_,
                 (Point2f)(outputColorSpace->w).super_Tuple2<pbrt::Point2,_float>);
    (this->XYZFromSensorRGB).m[2][2] = local_74.m[2][2];
    *(undefined8 *)(this->XYZFromSensorRGB).m[0] = local_74.m[0]._0_8_;
    *(undefined8 *)((this->XYZFromSensorRGB).m[0] + 2) = local_74.m._8_8_;
    *(undefined8 *)((this->XYZFromSensorRGB).m[1] + 1) = local_74.m[1]._4_8_;
    *(undefined8 *)(this->XYZFromSensorRGB).m[2] = local_74.m[2]._0_8_;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_50.values);
  }
  return;
}

Assistant:

PixelSensor(const RGBColorSpace *outputColorSpace, Float wbTemp, Float imagingRatio,
                Allocator alloc)
        : r_bar(&Spectra::X(), alloc),
          g_bar(&Spectra::Y(), alloc),
          b_bar(&Spectra::Z(), alloc),
          imagingRatio(imagingRatio) {
        // Compute white balancing matrix for XYZ _PixelSensor_
        if (wbTemp != 0) {
            auto whiteIlluminant = Spectra::D(wbTemp, alloc);
            Point2f sourceWhite = SpectrumToXYZ(&whiteIlluminant).xy();
            Point2f targetWhite = outputColorSpace->w;
            XYZFromSensorRGB = WhiteBalance(sourceWhite, targetWhite);
        }
    }